

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O2

void __thiscall
QueryTests_Truncate_canDetermineSpecificationForTruncate_Test::TestBody
          (QueryTests_Truncate_canDetermineSpecificationForTruncate_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper AStack_168;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  AssertionResult gtest_ar_;
  Query query_truncate;
  
  database::Query::Query(&query_truncate,"truncate container company.employee");
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = query_truncate.m_transaction_metatype == dml;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string((string *)&local_158,(string *)&query_truncate.m_database_name);
    gtest_ar_.success_ = std::operator==(&local_158,"company");
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&local_158);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)&gtest_ar_,
                 (AssertionResult *)"query_truncate.databaseName() == \"company\"","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xd0,local_158._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_160);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string((string *)&local_158,(string *)&query_truncate.m_container_name);
      bVar1 = std::operator==(&local_158,"employee");
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = bVar1;
      std::__cxx11::string::~string((string *)&local_158);
      if (bVar1) goto LAB_001128da;
      testing::Message::Message((Message *)&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)&gtest_ar_,
                 (AssertionResult *)"query_truncate.containerName() == \"employee\"","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xd1,local_158._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_160);
    }
  }
  else {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)&gtest_ar_,
               (AssertionResult *)"query_truncate.transactionMetaType() == database::dml","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xcf,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_160);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_168);
  std::__cxx11::string::~string((string *)&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_160);
LAB_001128da:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  database::Query::~Query(&query_truncate);
  return;
}

Assistant:

TEST(QueryTests_Truncate,canDetermineSpecificationForTruncate)
{
  database::Query query_truncate = "truncate container company.employee";
  ASSERT_TRUE(query_truncate.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_truncate.databaseName() == "company");
  ASSERT_TRUE(query_truncate.containerName() == "employee");
}